

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharacterUTF16(ImGuiIO *this,ImWchar16 c)

{
  ushort in_SI;
  long in_RDI;
  ImWchar cp;
  
  if (((in_SI != 0) || (*(short *)(in_RDI + 0x37a4) != 0)) &&
     ((*(byte *)(in_RDI + 0x37a1) & 1) != 0)) {
    if ((in_SI & 0xfc00) == 0xd800) {
      if (*(short *)(in_RDI + 0x37a4) != 0) {
        AddInputCharacter(this,_cp);
      }
      *(ushort *)(in_RDI + 0x37a4) = in_SI;
    }
    else {
      if (*(short *)(in_RDI + 0x37a4) != 0) {
        if ((in_SI & 0xfc00) != 0xdc00) {
          AddInputCharacter(this,_cp);
        }
        *(undefined2 *)(in_RDI + 0x37a4) = 0;
      }
      AddInputCharacter(this,_cp);
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacterUTF16(ImWchar16 c)
{
    if ((c == 0 && InputQueueSurrogate == 0) || !AppAcceptingEvents)
        return;

    if ((c & 0xFC00) == 0xD800) // High surrogate, must save
    {
        if (InputQueueSurrogate != 0)
            AddInputCharacter(IM_UNICODE_CODEPOINT_INVALID);
        InputQueueSurrogate = c;
        return;
    }

    ImWchar cp = c;
    if (InputQueueSurrogate != 0)
    {
        if ((c & 0xFC00) != 0xDC00) // Invalid low surrogate
        {
            AddInputCharacter(IM_UNICODE_CODEPOINT_INVALID);
        }
        else
        {
#if IM_UNICODE_CODEPOINT_MAX == 0xFFFF
            cp = IM_UNICODE_CODEPOINT_INVALID; // Codepoint will not fit in ImWchar
#else
            cp = (ImWchar)(((InputQueueSurrogate - 0xD800) << 10) + (c - 0xDC00) + 0x10000);
#endif
        }

        InputQueueSurrogate = 0;
    }
    AddInputCharacter((unsigned)cp);
}